

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Builtin_strtr(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  int iVar1;
  char *zString;
  char *zMask;
  char *pcVar2;
  char *zTo;
  char *zFrom;
  int local_88;
  int iOfft;
  int c;
  int tlen;
  int flen;
  int i;
  SyBlob sWorker;
  str_replace_data sRepData;
  int nLen;
  char *zIn;
  jx9_value **apArg_local;
  int nArg_local;
  jx9_context *pCtx_local;
  
  if (nArg < 1) {
    jx9_result_bool(pCtx,0);
  }
  else {
    zString = jx9_value_to_string(*apArg,(int *)((long)&sRepData.pCtx + 4));
    if (((int)sRepData.pCtx._4_4_ < 1) || (nArg < 2)) {
      jx9_result_string(pCtx,zString,sRepData.pCtx._4_4_);
    }
    else if ((nArg == 2) && (iVar1 = jx9_value_is_json_array(apArg[1]), iVar1 != 0)) {
      SyBlobInit((SyBlob *)&flen,&pCtx->pVm->sAllocator);
      SyBlobAppend((SyBlob *)&flen,zString,sRepData.pCtx._4_4_);
      sWorker._24_8_ = &flen;
      sRepData.pWorker = (SyBlob *)SyBlobSearch;
      jx9_array_walk(apArg[1],StringReplaceWalker,&sWorker.nFlags);
      jx9_result_string(pCtx,(char *)sWorker.pAllocator,(int)sWorker.pBlob);
      SyBlobRelease((SyBlob *)&flen);
    }
    else if (nArg < 3) {
      jx9_result_string(pCtx,zString,sRepData.pCtx._4_4_);
    }
    else {
      zMask = jx9_value_to_string(apArg[1],&c);
      pcVar2 = jx9_value_to_string(apArg[2],&iOfft);
      if ((c < 1) || (iOfft < 1)) {
        jx9_result_string(pCtx,zString,sRepData.pCtx._4_4_);
      }
      else {
        for (tlen = 0; tlen < (int)sRepData.pCtx._4_4_; tlen = tlen + 1) {
          local_88 = (int)zString[tlen];
          iVar1 = CheckMask(local_88,zMask,c,(int *)((long)&zFrom + 4));
          if ((iVar1 != 0) && (zFrom._4_4_ < iOfft)) {
            local_88 = (int)pcVar2[zFrom._4_4_];
          }
          jx9_result_string(pCtx,(char *)&local_88,1);
        }
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Builtin_strtr(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zIn;
	int nLen;
	if( nArg < 1 ){
		/* Nothing to replace, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	zIn = jx9_value_to_string(apArg[0], &nLen);
	if( nLen < 1 || nArg < 2 ){
		/* Invalid arguments */
		jx9_result_string(pCtx, zIn, nLen);
		return JX9_OK;
	}
	if( nArg == 2 && jx9_value_is_json_array(apArg[1]) ){
		str_replace_data sRepData;
		SyBlob sWorker;
		/* Initilaize the working buffer */
		SyBlobInit(&sWorker, &pCtx->pVm->sAllocator);
		/* Copy raw string */
		SyBlobAppend(&sWorker, (const void *)zIn, (sxu32)nLen);
		/* Init our replace data instance */
		sRepData.pWorker = &sWorker;
		sRepData.xMatch = SyBlobSearch;
		/* Iterate throw array entries and perform the replace operation.*/
		jx9_array_walk(apArg[1], StringReplaceWalker, &sRepData);
		/* All done, return the result string */
		jx9_result_string(pCtx, (const char *)SyBlobData(&sWorker), 
			(int)SyBlobLength(&sWorker)); /* Will make it's own copy */
		/* Clean-up */
		SyBlobRelease(&sWorker);
	}else{
		int i, flen, tlen, c, iOfft;
		const char *zFrom, *zTo;
		if( nArg < 3 ){
			/* Nothing to replace */
			jx9_result_string(pCtx, zIn, nLen);
			return JX9_OK;
		}
		/* Extract given arguments */
		zFrom = jx9_value_to_string(apArg[1], &flen);
		zTo = jx9_value_to_string(apArg[2], &tlen);
		if( flen < 1 || tlen < 1 ){
			/* Nothing to replace */
			jx9_result_string(pCtx, zIn, nLen);
			return JX9_OK;
		}
		/* Start the replace process */
		for( i = 0 ; i < nLen ; ++i ){
			c = zIn[i];
			if( CheckMask(c, zFrom, flen, &iOfft) ){
				if ( iOfft < tlen ){
					c = zTo[iOfft];
				}
			}
			jx9_result_string(pCtx, (const char *)&c, (int)sizeof(char));
			
		}
	}
	return JX9_OK;
}